

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rbuObjIterNext(sqlite3rbu *p,RbuObjIter *pIter)

{
  uchar *puVar1;
  int iVar2;
  
  iVar2 = p->rc;
  if (iVar2 == 0) {
    rbuObjIterClearStatements(pIter);
    iVar2 = 0;
    if (pIter->zIdx == (char *)0x0) {
      iVar2 = sqlite3_exec(p->dbMain,
                           "DROP TRIGGER IF EXISTS temp.rbu_insert_tr;DROP TRIGGER IF EXISTS temp.rbu_update1_tr;DROP TRIGGER IF EXISTS temp.rbu_update2_tr;DROP TRIGGER IF EXISTS temp.rbu_delete_tr;"
                           ,(sqlite3_callback)0x0,(void *)0x0,&p->zErrmsg);
    }
    if (iVar2 == 0) {
      if (pIter->bCleanup == 0) {
        iVar2 = 0;
        if (pIter->zIdx == (char *)0x0) {
          iVar2 = bindText(pIter->pIdxIter,1,pIter->zTbl,-1,(_func_void_void_ptr *)0x0,'\x01');
        }
        if (iVar2 == 0) {
          iVar2 = sqlite3_step(pIter->pIdxIter);
          if (iVar2 == 100) {
            puVar1 = sqlite3_column_text(pIter->pIdxIter,0);
            pIter->zIdx = (char *)puVar1;
            iVar2 = sqlite3_column_int(pIter->pIdxIter,1);
            pIter->iTnum = iVar2;
            iVar2 = sqlite3_column_int(pIter->pIdxIter,2);
            pIter->bUnique = iVar2;
            iVar2 = 7;
            if (pIter->zIdx != (char *)0x0) {
              iVar2 = 0;
            }
          }
          else {
            iVar2 = resetAndCollectError(pIter->pIdxIter,&p->zErrmsg);
            pIter->bCleanup = 1;
            pIter->zIdx = (char *)0x0;
          }
        }
      }
      else {
        rbuObjIterFreeCols(pIter);
        pIter->bCleanup = 0;
        iVar2 = sqlite3_step(pIter->pTblIter);
        if (iVar2 == 100) {
          iVar2 = 0;
          puVar1 = sqlite3_column_text(pIter->pTblIter,0);
          pIter->zTbl = (char *)puVar1;
          puVar1 = sqlite3_column_text(pIter->pTblIter,1);
          pIter->zDataTbl = (char *)puVar1;
          if (puVar1 == (uchar *)0x0) {
            iVar2 = 7;
          }
          else if (pIter->zTbl == (char *)0x0) {
            iVar2 = 7;
          }
        }
        else {
          iVar2 = resetAndCollectError(pIter->pTblIter,&p->zErrmsg);
          pIter->zTbl = (char *)0x0;
        }
      }
    }
  }
  if (iVar2 != 0) {
    rbuObjIterFinalize(pIter);
    p->rc = iVar2;
  }
  return iVar2;
}

Assistant:

static int rbuObjIterNext(sqlite3rbu *p, RbuObjIter *pIter){
  int rc = p->rc;
  if( rc==SQLITE_OK ){

    /* Free any SQLite statements used while processing the previous object */ 
    rbuObjIterClearStatements(pIter);
    if( pIter->zIdx==0 ){
      rc = sqlite3_exec(p->dbMain,
          "DROP TRIGGER IF EXISTS temp.rbu_insert_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_update1_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_update2_tr;"
          "DROP TRIGGER IF EXISTS temp.rbu_delete_tr;"
          , 0, 0, &p->zErrmsg
      );
    }

    if( rc==SQLITE_OK ){
      if( pIter->bCleanup ){
        rbuObjIterFreeCols(pIter);
        pIter->bCleanup = 0;
        rc = sqlite3_step(pIter->pTblIter);
        if( rc!=SQLITE_ROW ){
          rc = resetAndCollectError(pIter->pTblIter, &p->zErrmsg);
          pIter->zTbl = 0;
        }else{
          pIter->zTbl = (const char*)sqlite3_column_text(pIter->pTblIter, 0);
          pIter->zDataTbl = (const char*)sqlite3_column_text(pIter->pTblIter,1);
          rc = (pIter->zDataTbl && pIter->zTbl) ? SQLITE_OK : SQLITE_NOMEM;
        }
      }else{
        if( pIter->zIdx==0 ){
          sqlite3_stmt *pIdx = pIter->pIdxIter;
          rc = sqlite3_bind_text(pIdx, 1, pIter->zTbl, -1, SQLITE_STATIC);
        }
        if( rc==SQLITE_OK ){
          rc = sqlite3_step(pIter->pIdxIter);
          if( rc!=SQLITE_ROW ){
            rc = resetAndCollectError(pIter->pIdxIter, &p->zErrmsg);
            pIter->bCleanup = 1;
            pIter->zIdx = 0;
          }else{
            pIter->zIdx = (const char*)sqlite3_column_text(pIter->pIdxIter, 0);
            pIter->iTnum = sqlite3_column_int(pIter->pIdxIter, 1);
            pIter->bUnique = sqlite3_column_int(pIter->pIdxIter, 2);
            rc = pIter->zIdx ? SQLITE_OK : SQLITE_NOMEM;
          }
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    rbuObjIterFinalize(pIter);
    p->rc = rc;
  }
  return rc;
}